

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt16::read
          (PLYValueBigUInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  short sVar1;
  ushort uVar2;
  
  sVar1 = std::streambuf::sbumpc();
  this->value = sVar1 << 8;
  uVar2 = std::streambuf::sbumpc();
  this->value = this->value | uVar2 & 0xff;
  return (ssize_t)this;
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<unsigned short>((in->sbumpc()&0xff)<<8);
      value|=static_cast<unsigned short>(in->sbumpc()&0xff);
    }